

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  int nTerm;
  uint uVar1;
  Fts3Table *p_00;
  Fts3MultiSegReader *pFVar2;
  char *zTerm;
  bool bVar3;
  int iVar4;
  int iVar5;
  Fts3MultiSegReader **ppFVar6;
  ulong uVar7;
  code *xCmp;
  long lVar8;
  int iToken;
  Fts3Table *pTab;
  long lVar9;
  ulong uVar10;
  Fts3PhraseToken *pTok;
  long in_FS_OFFSET;
  bool bVar11;
  int local_60;
  char *local_48;
  int nThis;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_00 = (Fts3Table *)(pCsr->base).pVtab;
  bVar3 = false;
  bVar11 = false;
  if (((bOptOk != 0) && (pCsr->bDesc == p_00->bDescIdx)) && (p->nToken < 5)) {
    bVar11 = 0 < p->nToken;
  }
  pTok = p->aToken;
  ppFVar6 = &p->aToken[0].pSegcsr;
  lVar8 = 0;
  do {
    if (!bVar11) {
LAB_001b37a0:
      local_60 = 0;
      iVar4 = 0;
      for (lVar8 = 0; (iVar4 == 0 && (lVar8 < p->nToken)); lVar8 = lVar8 + 1) {
        if (pTok->pSegcsr == (Fts3MultiSegReader *)0x0) {
          iVar4 = 0;
        }
        else {
          nThis = 0;
          local_48 = (char *)0x0;
          iVar4 = fts3TermSelect(p_00,pTok,p->iColumn,&nThis,&local_48);
          if (iVar4 == 0) {
            iVar4 = fts3EvalPhraseMergeToken(p_00,p,(int)lVar8,local_48,nThis);
          }
        }
        pTok = pTok + 1;
      }
LAB_001b381b:
      p->bIncr = local_60;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return iVar4;
    }
    if (p->nToken <= lVar8) {
      if (bVar3) {
        iVar5 = -1;
        if (p->iColumn < p_00->nColumn) {
          iVar5 = p->iColumn;
        }
        local_60 = 1;
        iVar4 = 0;
        for (lVar8 = 0; (iVar4 == 0 && (lVar8 < p->nToken)); lVar8 = lVar8 + 1) {
          pFVar2 = p->aToken[lVar8].pSegcsr;
          iVar4 = 0;
          if (pFVar2 != (Fts3MultiSegReader *)0x0) {
            zTerm = pTok[lVar8].z;
            nTerm = pTok[lVar8].n;
            uVar1 = pFVar2->nSegment;
            xCmp = fts3SegReaderDoclistCmpRev;
            if (p_00->bDescIdx == '\0') {
              xCmp = fts3SegReaderDoclistCmp;
            }
            iVar4 = fts3SegReaderStart(p_00,pFVar2,zTerm,nTerm);
            if (iVar4 == 0) {
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              uVar10 = (ulong)uVar1;
              for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
                if (pFVar2->apSegment[uVar7]->aNode == (char *)0x0) {
                  uVar10 = uVar7 & 0xffffffff;
                  break;
                }
                iVar4 = fts3SegReaderTermCmp(pFVar2->apSegment[uVar7],zTerm,nTerm);
                if (iVar4 != 0) {
                  uVar10 = uVar7 & 0xffffffff;
                  break;
                }
              }
              pFVar2->nAdvance = (int)uVar10;
              for (lVar9 = 0; lVar9 < (int)uVar10; lVar9 = lVar9 + 1) {
                iVar4 = fts3SegReaderFirstDocid(p_00,pFVar2->apSegment[lVar9]);
                if (iVar4 != 0) goto LAB_001b3798;
                uVar10 = (ulong)(uint)pFVar2->nAdvance;
              }
              fts3SegReaderSort(pFVar2->apSegment,(int)lVar9,(int)lVar9,xCmp);
              pFVar2->iColFilter = iVar5;
              iVar4 = 0;
            }
          }
LAB_001b3798:
        }
        goto LAB_001b381b;
      }
      goto LAB_001b37a0;
    }
    pFVar2 = *ppFVar6;
    if (*(int *)(ppFVar6 + -2) == 0) {
      bVar11 = true;
      if (pFVar2 != (Fts3MultiSegReader *)0x0) {
        bVar11 = pFVar2->bLookup != 0;
        bVar3 = true;
      }
    }
    else {
      if (pFVar2 != (Fts3MultiSegReader *)0x0) {
        bVar3 = true;
      }
      bVar11 = false;
    }
    lVar8 = lVar8 + 1;
    ppFVar6 = ppFVar6 + 5;
  } while( true );
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk
   && pCsr->bDesc==pTab->bDescIdx
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#if defined(SQLITE_DEBUG) || defined(SQLITE_TEST)
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}